

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O2

MaxInt<unsigned_int>
miniscript::internal::operator|(MaxInt<unsigned_int> *a,MaxInt<unsigned_int> *b)

{
  uint uVar1;
  ulong uVar2;
  MaxInt<unsigned_int> MVar3;
  MaxInt<unsigned_int> MVar4;
  long in_FS_OFFSET;
  
  if (a->valid == false) {
    MVar3 = *b;
  }
  else {
    if (b->valid != false) {
      uVar1 = b->value;
      if (b->value < a->value) {
        uVar1 = a->value;
      }
      uVar2 = (ulong)uVar1;
      MVar4.valid = true;
      MVar4._1_3_ = 0;
      MVar4.value = 0;
      MVar3.valid = false;
      MVar3._1_3_ = 0;
      MVar3.value = 0;
      goto LAB_0032c146;
    }
    MVar3 = *a;
  }
  uVar2 = (ulong)MVar3 >> 0x20;
  MVar4 = MVar3;
LAB_0032c146:
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return (MaxInt<unsigned_int>)
           ((ulong)MVar4 & 0xff | (ulong)(MVar3._0_4_ & 0xffffff00) | uVar2 << 0x20);
  }
  __stack_chk_fail();
}

Assistant:

MaxInt<I> operator|(const MaxInt<I>& a, const MaxInt<I>& b) {
        if (!a.valid) return b;
        if (!b.valid) return a;
        return std::max(a.value, b.value);
    }